

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedMutexTest_RecurseLock_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedMutexTest_RecurseLock_Test<yamc::checked::timed_mutex> *this)

{
  bool bVar1;
  TypeParam mtx;
  AssertHelper AStack_c8;
  char *local_c0;
  char *local_b8;
  char local_b0 [24];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98 [4];
  mutex_base local_78;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)&local_78);
  local_b0[0] = '\0';
  local_b0[1] = '\0';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  local_b0[4] = '\0';
  local_b0[5] = '\0';
  local_b0[6] = '\0';
  local_b0[7] = '\0';
  local_b0[8] = '\0';
  local_b0[9] = '\0';
  local_b0[10] = '\0';
  local_b0[0xb] = '\0';
  local_b0[0xc] = '\0';
  local_b0[0xd] = '\0';
  local_b0[0xe] = '\0';
  local_b0[0xf] = '\0';
  local_b8 = (char *)0x0;
  local_c0 = local_b0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::mutex_base::lock(&local_78);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  local_b0[0] = '\0';
  local_b0[1] = '\0';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  local_b0[4] = '\0';
  local_b0[5] = '\0';
  local_b0[6] = '\0';
  local_b0[7] = '\0';
  local_b0[8] = '\0';
  local_b0[9] = '\0';
  local_b0[10] = '\0';
  local_b0[0xb] = '\0';
  local_b0[0xc] = '\0';
  local_b0[0xd] = '\0';
  local_b0[0xe] = '\0';
  local_b0[0xf] = '\0';
  local_b8 = (char *)0x0;
  local_c0 = local_b0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::mutex_base::lock(&local_78);
  }
  std::__cxx11::string::_M_replace((ulong)&local_c0,0,local_b8,0x1c19f6);
  testing::Message::Message((Message *)local_98);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,0x51,local_c0);
  testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)local_98);
  testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
  if (local_98[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_98[0]._M_head_impl + 8))();
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  local_b0[0] = '\0';
  local_b0[1] = '\0';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  local_b0[4] = '\0';
  local_b0[5] = '\0';
  local_b0[6] = '\0';
  local_b0[7] = '\0';
  local_b0[8] = '\0';
  local_b0[9] = '\0';
  local_b0[10] = '\0';
  local_b0[0xb] = '\0';
  local_b0[0xc] = '\0';
  local_b0[0xd] = '\0';
  local_b0[0xe] = '\0';
  local_b0[0xf] = '\0';
  local_b8 = (char *)0x0;
  local_c0 = local_b0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::mutex_base::unlock(&local_78);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  yamc::checked::timed_mutex::~timed_mutex((timed_mutex *)&local_78);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, RecurseLock) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.lock());
  ASSERT_NO_THROW(mtx.unlock());
}